

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  uint32_t uVar1;
  Platform PVar2;
  Dim DVar3;
  Variant *pVVar4;
  size_t sVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  SPIRVariable *pSVar9;
  SPIRType *pSVar10;
  CompilerError *this_00;
  runtime_error *prVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  string img_type_name;
  uint32_t array_size;
  SPIRType img_type_4;
  char (*in_stack_fffffffffffffe38) [2];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  uint32_t local_19c;
  char *local_198;
  undefined1 local_190 [24];
  uint32_t local_178;
  uint *local_170;
  size_t local_168;
  uint local_158 [8];
  bool *local_138;
  size_t local_130;
  bool local_120 [40];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  uVar8 = (ulong)id;
  if ((uVar8 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar8].type == TypeVariable)) {
    pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar8);
  }
  else {
    pSVar9 = (SPIRVariable *)0x0;
  }
  if ((pSVar9 != (SPIRVariable *)0x0) && (uVar1 = (pSVar9->basevariable).id, uVar1 != 0)) {
    id = uVar1;
  }
  sVar5 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar5 != 0) {
    PVar2 = (this->msl_options).platform;
    uVar12 = 20000;
    if (PVar2 == iOS) {
      uVar12 = 0x27d8;
    }
    if ((this->msl_options).msl_version < uVar12) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      if (PVar2 == iOS) {
        CompilerError::CompilerError
                  (this_00,"MSL 1.2 or greater is required for arrays of textures.");
      }
      else {
        CompilerError::CompilerError
                  (this_00,"MSL 2.0 or greater is required for arrays of textures.");
      }
LAB_00237174:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (sVar5 != 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Arrays of arrays of textures are not supported in MSL.")
      ;
      goto LAB_00237174;
    }
    pSVar10 = Compiler::get_pointee_type((Compiler *)this,type);
    pSVar10 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar10->parent_type).id);
    local_19c = get_resource_array_size(this,type,id);
    if (local_19c == 0) {
      add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptor);
      add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptorArray);
      local_1c0._M_p = "const spvDescriptorArray";
      if ((this->super_CompilerGLSL).processing_entry_point != false) {
        local_1c0._M_p = "const device spvDescriptor";
      }
      if ((member) && (local_1c0._M_p = "spvDescriptor", type->basetype == SampledImage)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Argument buffer runtime array currently not supported for combined image sampler."
                  );
        goto LAB_00237174;
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                ((char (*) [2])local_190,this,pSVar10,(ulong)id,0);
      local_198 = "";
      if ((this->super_CompilerGLSL).processing_entry_point != false) {
        local_198 = "*";
      }
      join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],char_const*>
                (__return_storage_ptr__,(spirv_cross *)&local_1c0,(char **)0x2d3e55,
                 (char (*) [2])local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d49aa,
                 (char (*) [2])&local_198,(char **)in_stack_fffffffffffffe38);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                ((char (*) [7])local_190,this,pSVar10,(ulong)id,0);
      join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x2c484c,(char (*) [7])local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d38e3,
                 (char (*) [3])&local_19c,(uint *)0x2d49aa,in_stack_fffffffffffffe38);
    }
    _Var13._M_p = (pointer)local_190._0_8_;
    if ((undefined1 *)local_190._0_8_ == local_190 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_00236c2f;
  }
  local_1b8 = 0;
  local_1b0 = 0;
  local_1c0._M_p = &local_1b0;
  bVar6 = Compiler::is_depth_image((Compiler *)this,type,id);
  DVar3 = (type->image).dim;
  if (bVar6) {
    switch(DVar3) {
    case Dim1D:
      if ((this->msl_options).texture_1D_as_2D == true) goto switchD_00236b26_caseD_1;
      break;
    case Dim2D:
switchD_00236b26_caseD_1:
      if ((((type->image).ms == true) && ((type->image).arrayed == true)) &&
         ((this->msl_options).msl_version < 0x4e84)) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar11,"Multisampled array textures are supported from 2.1.");
LAB_0023721e:
        *(undefined ***)prVar11 = &PTR__runtime_error_0035fca8;
        __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      break;
    case Dim3D:
      break;
    case DimCube:
    }
    goto LAB_00236f2e;
  }
  switch(DVar3) {
  case Dim1D:
  case Dim2D:
  case DimSubpassData:
    if (DVar3 == DimSubpassData) {
      bVar7 = 1;
      if ((this->msl_options).multiview == false) {
        bVar7 = (this->msl_options).arrayed_subpass_input;
      }
    }
    else {
      bVar7 = 0;
    }
    if ((DVar3 == Dim1D) && ((this->msl_options).texture_1D_as_2D == false)) {
LAB_00236eec:
      ::std::__cxx11::string::append((char *)&local_1c0);
      goto LAB_00236f38;
    }
    if ((DVar3 != DimSubpassData) ||
       ((type->basetype != Image || ((this->msl_options).use_framebuffer_fetch_subpasses != true))))
    {
      if (((type->image).ms == true) &&
         ((((bVar7 | (type->image).arrayed) & 1) != 0 && ((this->msl_options).msl_version < 0x4e84))
         )) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar11,"Multisampled array textures are supported from 2.1.");
        *(undefined ***)prVar11 = &PTR__runtime_error_0035fca8;
        __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_00236eec;
    }
    pSVar10 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
    SPIRType::SPIRType((SPIRType *)local_190,pSVar10);
    local_178 = 4;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,local_190,0);
    local_190._0_8_ = &PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_130 = 0;
    if (local_138 != local_120) {
      free(local_138);
    }
    local_168 = 0;
    if (local_170 != local_158) {
      free(local_170);
    }
    goto LAB_002370e7;
  case Dim3D:
    break;
  case DimCube:
    break;
  default:
    break;
  case DimBuffer:
    if (((type->image).ms != false) || ((type->image).arrayed == true)) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar11,"Cannot use texel buffers with multisampling or array layers.");
      goto LAB_0023721e;
    }
    if ((this->msl_options).texture_buffer_native != true) break;
    if ((this->msl_options).msl_version < 0x4e84) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar11,"Native texture_buffer type is only supported in MSL 2.1.");
      goto LAB_0023721e;
    }
    ::std::__cxx11::string::operator=((string *)&local_1c0,"texture_buffer");
    goto LAB_00236f38;
  }
LAB_00236f2e:
  ::std::__cxx11::string::append((char *)&local_1c0);
LAB_00236f38:
  ::std::__cxx11::string::append((char *)&local_1c0);
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_190,this,pSVar10,0);
  ::std::__cxx11::string::_M_append((char *)&local_1c0,local_190._0_8_);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
  if (((type->basetype == Image) && ((type->image).sampled == 2)) &&
     ((type->image).dim != DimSubpassData)) {
    if ((type->image).access < (AccessQualifierReadWrite|AccessQualifierWriteOnly)) {
      ::std::__cxx11::string::append((char *)&local_1c0);
    }
    else {
      pSVar9 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
      if (pSVar9 == (SPIRVariable *)0x0) {
LAB_0023702e:
        pSVar9 = (SPIRVariable *)0x0;
      }
      else {
        uVar8 = (ulong)(pSVar9->basevariable).id;
        if (uVar8 != 0) {
          if (((this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size <= uVar8) ||
             (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr,
             pVVar4[uVar8].type != TypeVariable)) goto LAB_0023702e;
          pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar8);
        }
      }
      if ((pSVar9 != (SPIRVariable *)0x0) &&
         (bVar6 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                             DecorationNonWritable), !bVar6)) {
        ::std::__cxx11::string::append((char *)&local_1c0);
        bVar6 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                           DecorationNonReadable);
        if (!bVar6) {
          ::std::__cxx11::string::append((char *)&local_1c0);
        }
        ::std::__cxx11::string::append((char *)&local_1c0);
      }
    }
  }
  ::std::__cxx11::string::append((char *)&local_1c0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1c0._M_p == &local_1b0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
  }
  __return_storage_ptr__->_M_string_length = local_1b8;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1c0._M_p = &local_1b0;
LAB_002370e7:
  _Var13._M_p = local_1c0._M_p;
  if (local_1c0._M_p == &local_1b0) {
    return __return_storage_ptr__;
  }
LAB_00236c2f:
  operator_delete(_Var13._M_p);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::image_type_glsl(const SPIRType &type, uint32_t id, bool member)
{
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
	{
		// For comparison images, check against the base variable,
		// and not the fake ID which might have been generated for this variable.
		id = var->basevariable;
	}

	if (!type.array.empty())
	{
		uint32_t major = 2, minor = 0;
		if (msl_options.is_ios())
		{
			major = 1;
			minor = 2;
		}
		if (!msl_options.supports_msl_version(major, minor))
		{
			if (msl_options.is_ios())
				SPIRV_CROSS_THROW("MSL 1.2 or greater is required for arrays of textures.");
			else
				SPIRV_CROSS_THROW("MSL 2.0 or greater is required for arrays of textures.");
		}

		if (type.array.size() > 1)
			SPIRV_CROSS_THROW("Arrays of arrays of textures are not supported in MSL.");

		// Arrays of images in MSL must be declared with a special array<T, N> syntax ala C++11 std::array.
		// If we have a runtime array, it could be a variable-count descriptor set binding.
		auto &parent = get<SPIRType>(get_pointee_type(type).parent_type);
		uint32_t array_size = get_resource_array_size(type, id);

		if (array_size == 0)
		{
			add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
			add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
			const char *descriptor_wrapper = processing_entry_point ? "const device spvDescriptor" : "const spvDescriptorArray";
			if (member)
			{
				descriptor_wrapper = "spvDescriptor";
				// This requires a specialized wrapper type that packs image and sampler side by side.
				// It is possible in theory.
				if (type.basetype == SPIRType::SampledImage)
					SPIRV_CROSS_THROW("Argument buffer runtime array currently not supported for combined image sampler.");
			}
			return join(descriptor_wrapper, "<", image_type_glsl(parent, id, false), ">",
			            processing_entry_point ? "*" : "");
		}
		else
		{
			return join("array<", image_type_glsl(parent, id, false), ", ", array_size, ">");
		}
	}

	string img_type_name;

	auto &img_type = type.image;

	if (is_depth_image(type, id))
	{
		switch (img_type.dim)
		{
		case Dim1D:
		case Dim2D:
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += "depth1d_unsupported_by_metal";
				break;
			}

			if (img_type.ms && img_type.arrayed)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "depth2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "depth2d_ms";
			else if (img_type.arrayed)
				img_type_name += "depth2d_array";
			else
				img_type_name += "depth2d";
			break;
		case Dim3D:
			img_type_name += "depth3d_unsupported_by_metal";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "depthcube_array" : "depthcube");
			else
				img_type_name += (img_type.arrayed ? "depth2d_array" : "depthcube");
			break;
		default:
			img_type_name += "unknown_depth_texture_type";
			break;
		}
	}
	else
	{
		switch (img_type.dim)
		{
		case DimBuffer:
			if (img_type.ms || img_type.arrayed)
				SPIRV_CROSS_THROW("Cannot use texel buffers with multisampling or array layers.");

			if (msl_options.texture_buffer_native)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Native texture_buffer type is only supported in MSL 2.1.");
				img_type_name = "texture_buffer";
			}
			else
				img_type_name += "texture2d";
			break;
		case Dim1D:
		case Dim2D:
		case DimSubpassData:
		{
			bool subpass_array =
			    img_type.dim == DimSubpassData && (msl_options.multiview || msl_options.arrayed_subpass_input);
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += (img_type.arrayed ? "texture1d_array" : "texture1d");
				break;
			}

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			if (type_is_msl_framebuffer_fetch(type))
			{
				auto img_type_4 = get<SPIRType>(img_type.type);
				img_type_4.vecsize = 4;
				return type_to_glsl(img_type_4);
			}
			if (img_type.ms && (img_type.arrayed || subpass_array))
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "texture2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "texture2d_ms";
			else if (img_type.arrayed || subpass_array)
				img_type_name += "texture2d_array";
			else
				img_type_name += "texture2d";
			break;
		}
		case Dim3D:
			img_type_name += "texture3d";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "texturecube_array" : "texturecube");
			else
				img_type_name += (img_type.arrayed ? "texture2d_array" : "texturecube");
			break;
		default:
			img_type_name += "unknown_texture_type";
			break;
		}
	}

	// Append the pixel type
	img_type_name += "<";
	img_type_name += type_to_glsl(get<SPIRType>(img_type.type));

	// For unsampled images, append the sample/read/write access qualifier.
	// For kernel images, the access qualifier my be supplied directly by SPIR-V.
	// Otherwise it may be set based on whether the image is read from or written to within the shader.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		switch (img_type.access)
		{
		case AccessQualifierReadOnly:
			img_type_name += ", access::read";
			break;

		case AccessQualifierWriteOnly:
			img_type_name += ", access::write";
			break;

		case AccessQualifierReadWrite:
			img_type_name += ", access::read_write";
			break;

		default:
		{
			auto *p_var = maybe_get_backing_variable(id);
			if (p_var && p_var->basevariable)
				p_var = maybe_get<SPIRVariable>(p_var->basevariable);
			if (p_var && !has_decoration(p_var->self, DecorationNonWritable))
			{
				img_type_name += ", access::";

				if (!has_decoration(p_var->self, DecorationNonReadable))
					img_type_name += "read_";

				img_type_name += "write";
			}
			break;
		}
		}
	}

	img_type_name += ">";

	return img_type_name;
}